

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O2

void duckdb::ApproxTopKUpdate<duckdb::string_t,duckdb::HistogramGenericFunctor>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t i;
  idx_t offset;
  UnifiedVectorFormat input_data;
  UnifiedVectorFormat sdata;
  Vector extra_state;
  long *local_128;
  long local_120;
  long local_118;
  long *local_e0;
  long local_d8;
  HistogramGenericFunctor local_98 [104];
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_e0);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  HistogramGenericFunctor::CreateExtraState(local_98,count);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_128);
  HistogramGenericFunctor::PrepareData
            (inputs,count,(Vector *)local_98,(UnifiedVectorFormat *)&local_128);
  for (offset = 0; count != offset; offset = offset + 1) {
    iVar2 = offset;
    if (*local_128 != 0) {
      iVar2 = (idx_t)*(uint *)(*local_128 + offset * 4);
    }
    if ((local_118 == 0) || ((*(ulong *)(local_118 + (iVar2 >> 6) * 8) >> (iVar2 & 0x3f) & 1) != 0))
    {
      iVar1 = offset;
      if (*local_e0 != 0) {
        iVar1 = (idx_t)*(uint *)(*local_e0 + offset * 4);
      }
      ApproxTopKOperation::Operation<duckdb::string_t,duckdb::ApproxTopKState>
                (*(ApproxTopKState **)(local_d8 + iVar1 * 8),(string_t *)(iVar2 * 0x10 + local_120),
                 aggr_input,inputs + 0x68,offset,count);
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_128);
  Vector::~Vector((Vector *)local_98);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_e0);
  return;
}

Assistant:

static void ApproxTopKUpdate(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count, Vector &state_vector,
                             idx_t count) {
	using STATE = ApproxTopKState;
	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto &top_k_vector = inputs[1];

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
	auto data = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		ApproxTopKOperation::Operation<T, STATE>(state, data[idx], aggr_input, top_k_vector, i, count);
	}
}